

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_from_stream.cc
# Opt level: O2

void __thiscall
sptk::InputSourceFromStream::InputSourceFromStream
          (InputSourceFromStream *this,bool zero_padding,int read_size,istream *input_stream)

{
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceInterface_00111ca0;
  this->zero_padding_ = zero_padding;
  this->read_size_ = read_size;
  this->input_stream_ = input_stream;
  this->is_valid_ = input_stream != (istream *)0x0 && 0 < read_size;
  return;
}

Assistant:

InputSourceFromStream::InputSourceFromStream(bool zero_padding, int read_size,
                                             std::istream* input_stream)
    : zero_padding_(zero_padding),
      read_size_(read_size),
      input_stream_(input_stream),
      is_valid_(true) {
  if (read_size_ <= 0 || NULL == input_stream_) {
    is_valid_ = false;
    return;
  }
}